

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O1

bool __thiscall pbrt::Transform::SwapsHandedness(Transform *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  fVar1 = (this->m).m[1][1];
  fVar2 = (this->m).m[1][2];
  fVar3 = (this->m).m[2][1];
  auVar9 = ZEXT416((uint)(this->m).m[2][2]);
  auVar6 = vfmsub213ss_fma(auVar9,ZEXT416((uint)fVar1),ZEXT416((uint)(fVar2 * fVar3)));
  auVar8 = vfnmadd231ss_fma(ZEXT416((uint)(fVar2 * fVar3)),ZEXT416((uint)fVar2),ZEXT416((uint)fVar3)
                           );
  fVar4 = (this->m).m[0][1];
  fVar5 = (this->m).m[2][0];
  auVar10 = ZEXT416((uint)(this->m).m[1][0]);
  auVar9 = vfmsub213ss_fma(auVar9,auVar10,ZEXT416((uint)(fVar2 * fVar5)));
  auVar7 = vfnmadd213ss_fma(ZEXT416((uint)fVar2),ZEXT416((uint)fVar5),ZEXT416((uint)(fVar2 * fVar5))
                           );
  fVar2 = auVar9._0_4_ + auVar7._0_4_;
  auVar9 = vfmsub213ss_fma(ZEXT416((uint)fVar3),auVar10,ZEXT416((uint)(fVar1 * fVar5)));
  auVar7 = vfnmadd213ss_fma(ZEXT416((uint)fVar5),ZEXT416((uint)fVar1),ZEXT416((uint)(fVar1 * fVar5))
                           );
  auVar10 = ZEXT416((uint)(fVar4 * fVar2));
  auVar6 = vfmsub132ss_fma(ZEXT416((uint)(auVar6._0_4_ + auVar8._0_4_)),auVar10,
                           ZEXT416((uint)(this->m).m[0][0]));
  auVar8 = vfnmadd213ss_fma(ZEXT416((uint)fVar2),ZEXT416((uint)fVar4),auVar10);
  auVar6 = vfmadd231ss_fma(ZEXT416((uint)(auVar6._0_4_ + auVar8._0_4_)),
                           ZEXT416((uint)(auVar9._0_4_ + auVar7._0_4_)),
                           ZEXT416((uint)(this->m).m[0][2]));
  return auVar6._0_4_ < 0.0;
}

Assistant:

bool Transform::SwapsHandedness() const {
    Float minor12 = DifferenceOfProducts(m[1][1], m[2][2], m[1][2], m[2][1]);
    Float minor02 = DifferenceOfProducts(m[1][0], m[2][2], m[1][2], m[2][0]);
    Float minor01 = DifferenceOfProducts(m[1][0], m[2][1], m[1][1], m[2][0]);
    Float det =
        m[0][2] * minor01 + DifferenceOfProducts(m[0][0], minor12, m[0][1], minor02);
    return det < 0;
}